

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::LogUnusedDependency
          (DescriptorBuilder *this,FileDescriptorProto *proto,FileDescriptor *result)

{
  DescriptorPool *pDVar1;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  bool bVar2;
  string *key;
  pointer ppVar3;
  reference ppFVar4;
  byte local_c9;
  VoidPtr local_c0;
  Invoker<std::__cxx11::basic_string<char>_> local_b8;
  string_view local_b0;
  VoidPtr local_a0;
  Invoker<std::__cxx11::basic_string<char>_> local_98;
  string_view local_90;
  anon_class_8_1_6f0ff714 local_80;
  anon_class_8_1_6f0ff714 make_error;
  FileDescriptor *unused;
  iterator __end3;
  iterator __begin3;
  flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *__range3;
  byte local_31;
  undefined1 auStack_30 [7];
  bool is_error;
  const_iterator itr;
  FileDescriptor *result_local;
  FileDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  itr.inner_.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)result;
  bVar2 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::empty(&(this->unused_dependency_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 );
  if (!bVar2) {
    pDVar1 = this->pool_;
    key = FileDescriptorProto::name_abi_cxx11_(proto);
    _auStack_30 = (iterator)
                  absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                  ::find<std::__cxx11::string>
                            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                              *)&pDVar1->direct_input_files_,key);
    ___range3 = (iterator)
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                       *)&this->pool_->direct_input_files_);
    bVar2 = absl::lts_20250127::container_internal::operator!=
                      ((const_iterator *)auStack_30,(const_iterator *)&__range3);
    local_c9 = 0;
    if (bVar2) {
      ppVar3 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               ::const_iterator::operator->((const_iterator *)auStack_30);
      local_c9 = ppVar3->second;
    }
    local_31 = local_c9 & 1;
    join_0x00000010_0x00000000_ =
         absl::lts_20250127::container_internal::
         raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
         ::begin(&(this->unused_dependency_).
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                );
    _unused = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::end(&(this->unused_dependency_).
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   );
    while (bVar2 = absl::lts_20250127::container_internal::operator!=
                             ((iterator *)&__end3.field_1,(iterator *)&unused), bVar2) {
      ppFVar4 = absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::iterator::operator*((iterator *)&__end3.field_1);
      make_error.unused = (FileDescriptor **)*ppFVar4;
      local_80.unused = (FileDescriptor **)&make_error;
      if ((local_31 & 1) == 0) {
        local_b0 = FileDescriptor::name((FileDescriptor *)make_error.unused);
        absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::LogUnusedDependency(google::protobuf::FileDescriptorProto_const&,google::protobuf::FileDescriptor_const*)::__0,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_c0,&local_80);
        make_error_01.invoker_ = local_b8;
        make_error_01.ptr_.obj = local_c0.obj;
        AddWarning(this,local_b0,&proto->super_Message,IMPORT,make_error_01);
      }
      else {
        local_90 = FileDescriptor::name((FileDescriptor *)make_error.unused);
        absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::LogUnusedDependency(google::protobuf::FileDescriptorProto_const&,google::protobuf::FileDescriptor_const*)::__0,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_a0,&local_80);
        make_error_00.invoker_ = local_98;
        make_error_00.ptr_.obj = local_a0.obj;
        AddError(this,local_90,&proto->super_Message,IMPORT,make_error_00);
      }
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::iterator::operator++((iterator *)&__end3.field_1);
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::LogUnusedDependency(const FileDescriptorProto& proto,
                                            const FileDescriptor* result) {
  (void)result;  // Parameter is used by Google-internal code.

  if (!unused_dependency_.empty()) {
    auto itr = pool_->direct_input_files_.find(proto.name());
    bool is_error = itr != pool_->direct_input_files_.end() && itr->second;
    for (const auto* unused : unused_dependency_) {
      auto make_error = [&] {
        return absl::StrCat("Import ", unused->name(), " is unused.");
      };
      if (is_error) {
        AddError(unused->name(), proto, DescriptorPool::ErrorCollector::IMPORT,
                 make_error);
      } else {
        AddWarning(unused->name(), proto,
                   DescriptorPool::ErrorCollector::IMPORT, make_error);
      }
    }
  }
}